

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall google::protobuf::EnumDescriptorProto::IsInitialized(EnumDescriptorProto *this)

{
  bool bVar1;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *t;
  EnumDescriptorProto *this_local;
  
  t = value(this);
  bVar1 = internal::
          AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>>
                    (t);
  if (bVar1) {
    bVar1 = has_options(this);
    if ((!bVar1) || (bVar1 = EnumOptions::IsInitialized(this->options_), bVar1)) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool EnumDescriptorProto::IsInitialized() const {
  if (!::google::protobuf::internal::AllAreInitialized(this->value())) return false;
  if (has_options()) {
    if (!this->options_->IsInitialized()) return false;
  }
  return true;
}